

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

IRet * __thiscall
deqp::gls::BuiltinPrecisionTests::Cond<float>::doApply
          (IRet *__return_storage_ptr__,Cond<float> *this,EvalContext *param_1,IArgs *iargs)

{
  double dVar1;
  Interval *pIVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined8 local_30;
  double dStack_28;
  double local_20;
  
  __return_storage_ptr__->m_hasNaN = false;
  __return_storage_ptr__->m_lo = INFINITY;
  __return_storage_ptr__->m_hi = -INFINITY;
  pIVar2 = iargs->a;
  dVar1 = pIVar2->m_lo;
  uVar3 = SUB84(dVar1,0);
  uVar4 = (undefined4)((ulong)dVar1 >> 0x20);
  if ((dVar1 <= 1.0) && (1.0 <= pIVar2->m_hi)) {
    tcu::Interval::operator|(__return_storage_ptr__,iargs->b);
    __return_storage_ptr__->m_hi = local_20;
    *(undefined8 *)__return_storage_ptr__ = local_30;
    __return_storage_ptr__->m_lo = dStack_28;
    pIVar2 = iargs->a;
    uVar3 = SUB84(pIVar2->m_lo,0);
    uVar4 = (undefined4)((ulong)pIVar2->m_lo >> 0x20);
  }
  if (((double)CONCAT44(uVar4,uVar3) <= 0.0) && (0.0 <= pIVar2->m_hi)) {
    tcu::Interval::operator|(__return_storage_ptr__,iargs->c);
    __return_storage_ptr__->m_hi = local_20;
    *(undefined8 *)__return_storage_ptr__ = local_30;
    __return_storage_ptr__->m_lo = dStack_28;
  }
  return __return_storage_ptr__;
}

Assistant:

IRet	doApply	(const EvalContext&, const IArgs& iargs)const
	{
		IRet	ret;

		if (iargs.a.contains(true))
			ret = unionIVal<T>(ret, iargs.b);

		if (iargs.a.contains(false))
			ret = unionIVal<T>(ret, iargs.c);

		return ret;
	}